

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

void kj::anon_unknown_9::rmrfChildrenAndClose(int fd)

{
  char *__s;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint *puVar4;
  dirent64 *pdVar5;
  size_t sVar6;
  ulong in_RCX;
  StringPtr path;
  Fault f;
  Fault f_5;
  Fault local_50;
  Fault local_48;
  undefined8 uStack_40;
  DIR *local_38;
  
  local_38 = fdopendir(fd);
  if (local_38 == (DIR *)0x0) {
    close(fd);
    __errno_location();
    local_50.exception = (Exception *)0x0;
    local_48.exception = (Exception *)0x0;
    uStack_40 = 0;
    kj::_::Debug::Fault::init
              (&local_50,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    kj::_::Debug::Fault::fatal(&local_50);
  }
  puVar4 = (uint *)__errno_location();
  do {
    *puVar4 = 0;
    pdVar5 = readdir64(local_38);
    if (pdVar5 == (dirent64 *)0x0) {
      in_RCX = (ulong)*puVar4;
      if (*puVar4 != 0) {
        local_50.exception = (Exception *)0x0;
        local_48.exception = (Exception *)0x0;
        uStack_40 = 0;
        kj::_::Debug::Fault::init
                  (&local_50,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                  );
        kj::_::Debug::Fault::fatal(&local_50);
      }
    }
    else if ((pdVar5->d_name[0] != '.') ||
            ((pdVar5->d_name[1] != '\0' &&
             ((pdVar5->d_name[1] != '.' || (pdVar5->d_name[2] != '\0')))))) {
      __s = pdVar5->d_name;
      if (pdVar5->d_type == '\0') {
        sVar6 = strlen(__s);
        path.content.size_ = in_RCX;
        path.content.ptr = (char *)(sVar6 + 1);
        bVar1 = rmrf((anon_unknown_9 *)(ulong)(uint)fd,(int)__s,path);
        local_50.exception._0_1_ = bVar1;
        if (!bVar1) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                    (&local_48,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0xc6,FAILED,"rmrf(fd, entry->d_name)","_kjCondition,",
                     (DebugExpression<bool> *)&local_50);
          kj::_::Debug::Fault::fatal(&local_48);
        }
      }
      else if (pdVar5->d_type == '\x04') {
        do {
          iVar2 = openat64(fd,__s,0xb0000);
          if (-1 < iVar2) {
            iVar3 = 0;
            break;
          }
          iVar3 = kj::_::Debug::getOsErrorNumber(false);
        } while (iVar3 == -1);
        if (iVar3 != 0) {
          local_50.exception = (Exception *)0x0;
          local_48.exception = (Exception *)0x0;
          uStack_40 = 0;
          kj::_::Debug::Fault::init
                    (&local_50,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                    );
          kj::_::Debug::Fault::fatal(&local_50);
        }
        rmrfChildrenAndClose(iVar2);
        do {
          iVar2 = unlinkat(fd,__s,0x200);
          if (-1 < iVar2) {
            iVar2 = 0;
            break;
          }
          iVar2 = kj::_::Debug::getOsErrorNumber(false);
        } while (iVar2 == -1);
        if (iVar2 != 0) {
          local_50.exception = (Exception *)0x0;
          local_48.exception = (Exception *)0x0;
          uStack_40 = 0;
          kj::_::Debug::Fault::init
                    (&local_50,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                    );
          kj::_::Debug::Fault::fatal(&local_50);
        }
      }
      else {
        do {
          iVar3 = 0;
          iVar2 = unlinkat(fd,__s,0);
          if (-1 < iVar2) break;
          iVar3 = kj::_::Debug::getOsErrorNumber(false);
        } while (iVar3 == -1);
        if (iVar3 != 0) {
          local_50.exception = (Exception *)0x0;
          local_48.exception = (Exception *)0x0;
          uStack_40 = 0;
          kj::_::Debug::Fault::init
                    (&local_50,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                    );
          kj::_::Debug::Fault::fatal(&local_50);
        }
      }
    }
    if (pdVar5 == (dirent64 *)0x0) {
      closedir(local_38);
      return;
    }
  } while( true );
}

Assistant:

static void rmrfChildrenAndClose(int fd) {
  // Assumes fd is seeked to beginning.

  DIR* dir = fdopendir(fd);
  if (dir == nullptr) {
    close(fd);
    KJ_FAIL_SYSCALL("fdopendir", errno);
  };
  KJ_DEFER(closedir(dir));

  for (;;) {
    errno = 0;
    struct dirent* entry = readdir(dir);
    if (entry == nullptr) {
      int error = errno;
      if (error == 0) {
        break;
      } else {
        KJ_FAIL_SYSCALL("readdir", error);
      }
    }

    if (entry->d_name[0] == '.' &&
        (entry->d_name[1] == '\0' ||
         (entry->d_name[1] == '.' &&
          entry->d_name[2] == '\0'))) {
      // ignore . and ..
    } else {
#ifdef DT_UNKNOWN    // d_type is not available on all platforms.
      if (entry->d_type == DT_DIR) {
        int subdirFd;
        KJ_SYSCALL(subdirFd = openat(
            fd, entry->d_name, O_RDONLY | MAYBE_O_DIRECTORY | MAYBE_O_CLOEXEC | O_NOFOLLOW));
        rmrfChildrenAndClose(subdirFd);
        KJ_SYSCALL(unlinkat(fd, entry->d_name, AT_REMOVEDIR));
      } else if (entry->d_type != DT_UNKNOWN) {
        KJ_SYSCALL(unlinkat(fd, entry->d_name, 0));
      } else {
#endif
        KJ_ASSERT(rmrf(fd, entry->d_name));
#ifdef DT_UNKNOWN
      }
#endif
    }
  }
}